

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O2

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceUnsigned<double,unsigned_int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  BinaryOp op;
  uintptr_t uVar1;
  uint uVar2;
  Index index;
  UnaryOp op_00;
  LocalSet *left;
  Const *pCVar3;
  Binary *left_00;
  LocalGet *pLVar4;
  Binary *right;
  Unary *ifTrue;
  If *expression;
  ulong in_R8;
  optional<wasm::Type> type;
  Builder local_40;
  Builder builder;
  
  uVar2 = curr->op - TruncSatUFloat32ToInt32;
  if ((uVar2 < 7) && ((0x55U >> (uVar2 & 0x1f) & 1) != 0)) {
    builder.wasm._0_4_ = *(undefined4 *)(&DAT_00e172cc + (ulong)uVar2 * 4);
    op = *(BinaryOp *)(&DAT_00e172e8 + (ulong)uVar2 * 4);
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
         ).
         super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .
         super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .currModule;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                            ).
                            super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .
                            super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .currFunction,(Type)(curr->value->type).id);
    left = Builder::makeLocalTee(&local_40,index,curr->value,(Type)(curr->value->type).id);
    pCVar3 = Builder::makeConst<double>(&local_40,4294967295.0);
    left_00 = Builder::makeBinary(&local_40,op,(Expression *)left,(Expression *)pCVar3);
    uVar1 = (curr->value->type).id;
    pLVar4 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar4->index = index;
    (pLVar4->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    pCVar3 = Builder::makeConst<double>(&local_40,0.0);
    right = Builder::makeBinary(&local_40,(BinaryOp)builder.wasm,(Expression *)pLVar4,
                                (Expression *)pCVar3);
    builder.wasm = (Module *)
                   Builder::makeBinary(&local_40,AndInt32,(Expression *)left_00,(Expression *)right)
    ;
    op_00 = getReplacementOp(this,curr->op);
    uVar1 = (curr->value->type).id;
    pLVar4 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar4->index = index;
    (pLVar4->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    ifTrue = Builder::makeUnary(&local_40,op_00,(Expression *)pLVar4);
    pCVar3 = Builder::makeConst<unsigned_int>(&local_40,0);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
    expression = Builder::makeIf(&local_40,(Expression *)builder.wasm,(Expression *)ifTrue,
                                 (Expression *)pCVar3,type);
    Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      .
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                     ,(Expression *)expression);
    return;
  }
  handle_unreachable("Unexpected opcode",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                     ,0x69);
}

Assistant:

void replaceUnsigned(Unary* curr) {
    BinaryOp ltOp, geOp;

    switch (curr->op) {
      case TruncSatUFloat32ToInt32:
      case TruncSatUFloat32ToInt64:
        ltOp = LtFloat32;
        geOp = GeFloat32;
        break;
      case TruncSatUFloat64ToInt32:
      case TruncSatUFloat64ToInt64:
        ltOp = LtFloat64;
        geOp = GeFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if op < INT_MAX and op >= 0 then use the trapping operation, else return
    // 0
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          ltOp,
          builder.makeLocalTee(v, curr->value, curr->value->type),
          builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
        builder.makeBinary(geOp,
                           builder.makeLocalGet(v, curr->value->type),
                           builder.makeConst(static_cast<From>(0.0)))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(static_cast<To>(0))));
  }